

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QSize __thiscall QRenderRule::boxSize(QRenderRule *this,QSize *cs,int flags)

{
  long lVar1;
  int iVar2;
  QSize QVar3;
  undefined4 in_EDX;
  QPoint *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QSize bs;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QSize *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffcc;
  QRect *in_stack_ffffffffffffffd0;
  QRenderRule *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QPoint::QPoint((QPoint *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                 in_stack_ffffffffffffff98);
  QRect::QRect(in_RDI,in_RSI,(QSize *)CONCAT44(in_EDX,in_stack_ffffffffffffffb0));
  boxRect(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  QVar3 = QRect::size((QRect *)CONCAT44(in_EDX,in_stack_ffffffffffffffb0));
  iVar2 = QSize::width((QSize *)0x423c82);
  if (iVar2 < 0) {
    QSize::setWidth(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  iVar2 = QSize::height((QSize *)0x423ca0);
  if (iVar2 < 0) {
    QSize::setHeight(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QSize QRenderRule::boxSize(const QSize &cs, int flags) const
{
    QSize bs = boxRect(QRect(QPoint(0, 0), cs), flags).size();
    if (cs.width() < 0) bs.setWidth(-1);
    if (cs.height() < 0) bs.setHeight(-1);
    return bs;
}